

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O3

int CfdGetDescriptorData
              (void *handle,void *descriptor_handle,uint32_t index,uint32_t *max_index,
              uint32_t *depth,int *script_type,char **locking_script,char **address,int *hash_type,
              char **redeem_script,int *key_type,char **pubkey,char **ext_pubkey,char **ext_privkey,
              bool *is_multisig,uint32_t *max_key_num,uint32_t *req_sig_num)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  bool bVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  CfdException *this;
  pointer puVar11;
  uint32_t uVar12;
  ulong uVar13;
  int *piVar14;
  char *work_pubkey;
  char *work_ext_pubkey;
  char *work_redeem_script;
  char *work_address;
  char *work_locking_script;
  string addr;
  undefined1 local_238 [40];
  pointer local_210;
  pointer puStack_208;
  pointer local_200;
  pointer local_1f8;
  pointer puStack_1f0;
  pointer local_1e8;
  pointer local_1e0;
  pointer puStack_1d8;
  pointer puStack_1d0;
  pointer local_1c8;
  char *local_1c0;
  uint32_t local_1b4;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  Pubkey local_188;
  void *local_168;
  char *local_160;
  char *local_158;
  undefined8 local_150;
  undefined1 local_148 [40];
  pointer local_120;
  pointer puStack_118;
  pointer local_110;
  pointer local_108;
  pointer puStack_100;
  pointer local_f8;
  pointer local_f0;
  pointer local_e8;
  pointer puStack_e0;
  pointer local_d8;
  SchnorrPubkey local_c8;
  ExtPubkey local_a8;
  void *local_38;
  
  local_190 = (char *)0x0;
  local_198 = (char *)0x0;
  local_1a0 = (char *)0x0;
  local_1c0 = (char *)0x0;
  local_1a8 = (char *)0x0;
  local_150 = 0;
  local_1b4 = index;
  local_168 = handle;
  cfd::Initialize();
  puVar11 = local_148 + 0x10;
  local_148._0_8_ = puVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"Descriptor","");
  cfd::capi::CheckBuffer(descriptor_handle,(string *)local_148);
  if ((pointer)local_148._0_8_ != puVar11) {
    operator_delete((void *)local_148._0_8_);
  }
  plVar2 = *(long **)((long)descriptor_handle + 0x18);
  local_38 = descriptor_handle;
  if (plVar2 == (long *)0x0) {
LAB_003d84e6:
    local_148._0_8_ = "cfdcapi_address.cpp";
    local_148._8_4_ = 0x27e;
    local_148._16_8_ = "CfdGetDescriptorData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_148,kCfdLogLevelWarning,"index is maximum over.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_148._0_8_ = puVar11;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"Failed to parameter. index is maximum over.","");
    cfd::core::CfdException::CfdException(this,kCfdOutOfRangeError,(string *)local_148);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar7 = (ulong)local_1b4;
  lVar3 = *plVar2;
  uVar13 = (plVar2[1] - lVar3 >> 3) * -0x254813e22cbce4a9;
  if (uVar13 < uVar7 || uVar13 - uVar7 == 0) goto LAB_003d84e6;
  uVar12 = (int)uVar13 - 1;
  if (max_index != (uint32_t *)0x0) {
    *max_index = uVar12;
  }
  piVar14 = (int *)(lVar3 + uVar7 * 0x338);
  if (depth != (uint32_t *)0x0) {
    *depth = piVar14[0x10];
  }
  if (script_type != (int *)0x0) {
    *script_type = *piVar14;
  }
  if (locking_script == (char **)0x0) {
LAB_003d7b94:
    local_158 = (char *)0x0;
  }
  else {
    bVar6 = cfd::core::Script::IsEmpty((Script *)(piVar14 + 2));
    if (bVar6) goto LAB_003d7b94;
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_148,(Script *)(piVar14 + 2));
    local_190 = cfd::capi::CreateString((string *)local_148);
    local_158 = local_190;
    if ((pointer)local_148._0_8_ != puVar11) {
      operator_delete((void *)local_148._0_8_);
    }
  }
  if (address == (char **)0x0) {
LAB_003d7c59:
    local_1b0 = (char *)0x0;
  }
  else {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_148,(Address *)(piVar14 + 0x12));
    uVar5 = local_148._8_8_;
    if ((pointer)local_148._0_8_ != puVar11) {
      operator_delete((void *)local_148._0_8_);
    }
    if ((pointer)uVar5 == (pointer)0x0) goto LAB_003d7c59;
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_148,(Address *)(piVar14 + 0x12));
    if ((pointer)local_148._8_8_ == (pointer)0x0) {
      local_1b0 = (char *)0x0;
    }
    else {
      local_1b0 = cfd::capi::CreateString((string *)local_148);
      local_198 = local_1b0;
    }
    if ((pointer)local_148._0_8_ != puVar11) {
      operator_delete((void *)local_148._0_8_);
    }
  }
  if (hash_type != (int *)0x0) {
    *hash_type = piVar14[0x70];
  }
  if (redeem_script == (char **)0x0) {
LAB_003d7cb9:
    local_160 = (char *)0x0;
  }
  else {
    bVar6 = cfd::core::Script::IsEmpty((Script *)(piVar14 + 0x72));
    if (bVar6) goto LAB_003d7cb9;
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_148,(Script *)(piVar14 + 0x72));
    local_1a0 = cfd::capi::CreateString((string *)local_148);
    local_160 = local_1a0;
    if ((pointer)local_148._0_8_ != puVar11) {
      operator_delete((void *)local_148._0_8_);
    }
  }
  if (key_type != (int *)0x0) {
    *key_type = piVar14[0x80];
  }
  cfd::core::Pubkey::Pubkey(&local_188);
  cfd::core::ExtPubkey::ExtPubkey(&local_a8);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_148);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_c8);
  iVar1 = piVar14[0x80];
  if (iVar1 == 2) {
    cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_238,(string *)(piVar14 + 0x82));
    puVar11 = local_a8.serialize_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_a8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
    local_a8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
    local_a8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_238._16_8_;
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    puVar11 = local_a8.chaincode_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_a8.version_ = local_238._24_4_;
    local_a8.fingerprint_ = local_238._28_4_;
    local_a8.depth_ = local_238[0x20];
    local_a8._33_3_ = local_238._33_3_;
    local_a8.child_num_ = local_238._36_4_;
    local_a8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_210;
    local_a8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_208;
    local_a8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_200;
    local_210 = (pointer)0x0;
    puStack_208 = (pointer)0x0;
    local_200 = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    puVar11 = local_a8.pubkey_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_a8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_1f8;
    local_a8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_1f0;
    local_a8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_1e8;
    local_1f8 = (pointer)0x0;
    puStack_1f0 = (pointer)0x0;
    local_1e8 = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
    }
    puVar11 = local_a8.tweak_sum_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_a8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_1e0;
    local_a8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_1d8;
    local_a8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_1d0;
    local_1e0 = (pointer)0x0;
    puStack_1d8 = (pointer)0x0;
    puStack_1d0 = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
      if (local_1e0 != (pointer)0x0) {
        operator_delete(local_1e0);
      }
    }
    if (local_1f8 != (pointer)0x0) {
      operator_delete(local_1f8);
    }
    if (local_210 != (pointer)0x0) {
      operator_delete(local_210);
    }
    if ((pointer)local_238._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_238._0_8_);
    }
    cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_238,&local_a8);
LAB_003d81cc:
    puVar11 = local_188.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
    local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
    local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_238._16_8_;
LAB_003d81ed:
    local_238._0_8_ = (pointer)0x0;
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = (pointer)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11);
      if ((pointer)local_238._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_238._0_8_);
      }
    }
  }
  else {
    if (iVar1 == 3) {
      cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_238,(string *)(piVar14 + 0x82));
      uVar5 = local_148._0_8_;
      local_148._0_8_ = local_238._0_8_;
      local_148._8_8_ = local_238._8_8_;
      local_148._16_8_ = local_238._16_8_;
      local_238._0_8_ = (pointer)0x0;
      local_238._8_8_ = (pointer)0x0;
      local_238._16_8_ = (pointer)0x0;
      if ((pointer)uVar5 != (pointer)0x0) {
        operator_delete((void *)uVar5);
      }
      puVar11 = local_120;
      local_148._24_8_ = local_238._24_8_;
      local_148._32_8_ = local_238._32_8_;
      local_120 = local_210;
      puStack_118 = puStack_208;
      local_110 = local_200;
      local_210 = (pointer)0x0;
      puStack_208 = (pointer)0x0;
      local_200 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_108;
      local_108 = local_1f8;
      puStack_100 = puStack_1f0;
      local_f8 = local_1e8;
      local_1f8 = (pointer)0x0;
      puStack_1f0 = (pointer)0x0;
      local_1e8 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_e8;
      local_f0 = local_1e0;
      local_e8 = puStack_1d8;
      puStack_e0 = puStack_1d0;
      local_d8 = local_1c8;
      puStack_1d8 = (pointer)0x0;
      puStack_1d0 = (pointer)0x0;
      local_1c8 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
        if (puStack_1d8 != (pointer)0x0) {
          operator_delete(puStack_1d8);
        }
      }
      if (local_1f8 != (pointer)0x0) {
        operator_delete(local_1f8);
      }
      if (local_210 != (pointer)0x0) {
        operator_delete(local_210);
      }
      if ((pointer)local_238._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_238._0_8_);
      }
      cfd::core::ExtPrivkey::GetExtPubkey((ExtPubkey *)local_238,(ExtPrivkey *)local_148);
      puVar11 = local_a8.serialize_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_a8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
      local_a8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
      local_a8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_238._16_8_;
      local_238._0_8_ = (pointer)0x0;
      local_238._8_8_ = (pointer)0x0;
      local_238._16_8_ = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_a8.chaincode_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_a8.version_ = local_238._24_4_;
      local_a8.fingerprint_ = local_238._28_4_;
      local_a8.depth_ = local_238[0x20];
      local_a8._33_3_ = local_238._33_3_;
      local_a8.child_num_ = local_238._36_4_;
      local_a8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_210;
      local_a8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_208;
      local_a8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = local_200;
      local_210 = (pointer)0x0;
      puStack_208 = (pointer)0x0;
      local_200 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_a8.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_a8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = local_1f8;
      local_a8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = puStack_1f0;
      local_a8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1e8;
      local_1f8 = (pointer)0x0;
      puStack_1f0 = (pointer)0x0;
      local_1e8 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
      }
      puVar11 = local_a8.tweak_sum_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_a8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_1e0;
      local_a8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_1d8;
      local_a8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_1d0;
      local_1e0 = (pointer)0x0;
      puStack_1d8 = (pointer)0x0;
      puStack_1d0 = (pointer)0x0;
      if (puVar11 != (pointer)0x0) {
        operator_delete(puVar11);
        if (local_1e0 != (pointer)0x0) {
          operator_delete(local_1e0);
        }
      }
      if (local_1f8 != (pointer)0x0) {
        operator_delete(local_1f8);
      }
      if (local_210 != (pointer)0x0) {
        operator_delete(local_210);
      }
      if ((pointer)local_238._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_238._0_8_);
      }
      cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_238,&local_a8);
      goto LAB_003d81cc;
    }
    if (iVar1 == 4) {
      cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_238,(string *)(piVar14 + 0x82))
      ;
      puVar11 = local_c8.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_238._0_8_;
      local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)local_238._8_8_;
      local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)local_238._16_8_;
      goto LAB_003d81ed;
    }
    if (*(long *)(piVar14 + 0x84) != 0) {
      cfd::core::Pubkey::Pubkey((Pubkey *)local_238,(string *)(piVar14 + 0x82));
      goto LAB_003d81cc;
    }
  }
  if (pubkey == (char **)0x0) {
LAB_003d8291:
    pcVar8 = (char *)0x0;
  }
  else {
    bVar6 = cfd::core::Pubkey::IsValid(&local_188);
    if (bVar6) {
      cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_238,&local_188);
      pcVar8 = cfd::capi::CreateString((string *)local_238);
    }
    else {
      bVar6 = cfd::core::SchnorrPubkey::IsValid(&local_c8);
      if (!bVar6) goto LAB_003d8291;
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_238,&local_c8);
      pcVar8 = cfd::capi::CreateString((string *)local_238);
    }
    local_1c0 = pcVar8;
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_);
    }
  }
  if (ext_pubkey == (char **)0x0) {
LAB_003d82e7:
    pcVar9 = (char *)0x0;
  }
  else {
    bVar6 = cfd::core::ExtPubkey::IsValid(&local_a8);
    if (!bVar6) goto LAB_003d82e7;
    cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)local_238,&local_a8);
    pcVar9 = cfd::capi::CreateString((string *)local_238);
    local_1a8 = pcVar9;
    if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
      operator_delete((void *)local_238._0_8_);
    }
  }
  if (ext_privkey != (char **)0x0) {
    bVar6 = cfd::core::ExtPrivkey::IsValid((ExtPrivkey *)local_148);
    if (bVar6) {
      cfd::core::ExtPrivkey::ToString_abi_cxx11_((string *)local_238,(ExtPrivkey *)local_148);
      pcVar10 = cfd::capi::CreateString((string *)local_238);
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_);
      }
      goto LAB_003d833a;
    }
  }
  pcVar10 = (char *)0x0;
LAB_003d833a:
  if (is_multisig != (bool *)0x0) {
    lVar3 = **(long **)((long)local_38 + 0x20);
    lVar4 = (*(long **)((long)local_38 + 0x20))[1];
    if (uVar12 == local_1b4 && lVar3 != lVar4) {
      *is_multisig = true;
      if (max_key_num != (uint32_t *)0x0) {
        *max_key_num = (int)((ulong)(lVar4 - lVar3) >> 3) * -0x33333333;
      }
      if (req_sig_num != (uint32_t *)0x0) {
        *req_sig_num = piVar14[0x8a];
      }
    }
    else {
      *is_multisig = false;
    }
  }
  if (local_158 != (char *)0x0) {
    *locking_script = local_158;
  }
  if (local_1b0 != (char *)0x0) {
    *address = local_1b0;
  }
  if (local_160 != (char *)0x0) {
    *redeem_script = local_160;
  }
  if (pcVar8 != (char *)0x0) {
    *pubkey = pcVar8;
  }
  if (pcVar9 != (char *)0x0) {
    *ext_pubkey = pcVar9;
  }
  if (pcVar10 != (char *)0x0) {
    *ext_privkey = pcVar10;
  }
  if (local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8 != (pointer)0x0) {
    operator_delete(local_e8);
  }
  if (local_108 != (pointer)0x0) {
    operator_delete(local_108);
  }
  if (local_120 != (pointer)0x0) {
    operator_delete(local_120);
  }
  if ((pointer)local_148._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._0_8_);
  }
  if (local_a8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_188.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdGetDescriptorData(
    void* handle, void* descriptor_handle, uint32_t index, uint32_t* max_index,
    uint32_t* depth, int* script_type, char** locking_script, char** address,
    int* hash_type, char** redeem_script, int* key_type, char** pubkey,
    char** ext_pubkey, char** ext_privkey, bool* is_multisig,
    uint32_t* max_key_num, uint32_t* req_sig_num) {
  char* work_locking_script = nullptr;
  char* work_address = nullptr;
  char* work_redeem_script = nullptr;
  char* work_pubkey = nullptr;
  char* work_ext_pubkey = nullptr;
  char* work_ext_privkey = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(descriptor_handle, kPrefixOutputDescriptor);

    CfdCapiOutputDescriptor* buffer =
        static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
    if ((buffer->script_list == nullptr) ||
        (index >= buffer->script_list->size())) {
      warn(CFD_LOG_SOURCE, "index is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index is maximum over.");
    }

    const DescriptorScriptData& desc_data = buffer->script_list->at(index);
    uint32_t last_index =
        static_cast<uint32_t>(buffer->script_list->size()) - 1;
    if (max_index != nullptr) *max_index = last_index;
    if (depth != nullptr) *depth = desc_data.depth;
    if (script_type != nullptr) *script_type = desc_data.type;
    if ((locking_script != nullptr) && (!desc_data.locking_script.IsEmpty())) {
      work_locking_script = CreateString(desc_data.locking_script.GetHex());
    }
    if ((address != nullptr) && (!desc_data.address.GetAddress().empty())) {
      std::string addr = desc_data.address.GetAddress();
      if (!addr.empty()) work_address = CreateString(addr);
    }
    if (hash_type != nullptr) {
      *hash_type = desc_data.address_type;
    }
    if ((redeem_script != nullptr) && (!desc_data.redeem_script.IsEmpty())) {
      work_redeem_script = CreateString(desc_data.redeem_script.GetHex());
    }
    if (key_type != nullptr) {
      *key_type = desc_data.key_type;
    }

    Pubkey pubkey_obj;
    ExtPubkey ext_pubkey_obj;
    ExtPrivkey ext_privkey_obj;
    SchnorrPubkey schnorr_pubkey_obj;
    switch (desc_data.key_type) {
      case DescriptorKeyType::kDescriptorKeyBip32Priv:
        ext_privkey_obj = ExtPrivkey(desc_data.key);
        ext_pubkey_obj = ext_privkey_obj.GetExtPubkey();
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyBip32:
        ext_pubkey_obj = ExtPubkey(desc_data.key);
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeySchnorr:
        schnorr_pubkey_obj = SchnorrPubkey(desc_data.key);
        break;
      case DescriptorKeyType::kDescriptorKeyPublic:
      default:
        if (!desc_data.key.empty()) pubkey_obj = Pubkey(desc_data.key);
        break;
    }
    if ((pubkey != nullptr) && (pubkey_obj.IsValid())) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    } else if ((pubkey != nullptr) && (schnorr_pubkey_obj.IsValid())) {
      work_pubkey = CreateString(schnorr_pubkey_obj.GetHex());
    }
    if ((ext_pubkey != nullptr) && (ext_pubkey_obj.IsValid())) {
      work_ext_pubkey = CreateString(ext_pubkey_obj.ToString());
    }
    if ((ext_privkey != nullptr) && (ext_privkey_obj.IsValid())) {
      work_ext_privkey = CreateString(ext_privkey_obj.ToString());
    }
    if (is_multisig != nullptr) {
      if ((!buffer->multisig_key_list->empty()) && (index == last_index)) {
        *is_multisig = true;
        if (max_key_num != nullptr) {
          *max_key_num =
              static_cast<uint32_t>(buffer->multisig_key_list->size());
        }
        if (req_sig_num != nullptr) {
          *req_sig_num = static_cast<uint32_t>(desc_data.multisig_req_sig_num);
        }
      } else {
        *is_multisig = false;
      }
    }

    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_address != nullptr) *address = work_address;
    if (work_redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    if (work_ext_pubkey != nullptr) *ext_pubkey = work_ext_pubkey;
    if (work_ext_privkey != nullptr) *ext_privkey = work_ext_privkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}